

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  shared_ptr<IElement> tree;
  vector<Token,_std::allocator<Token>_> res;
  string input;
  undefined1 local_80 [16];
  vector<Token,_std::allocator<Token>_> local_70;
  string local_58;
  string local_38 [32];
  undefined8 *local_18;
  char *local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"(13 - 4) - (12 + 1)",(allocator<char> *)&local_70);
  std::__cxx11::string::string((string *)&local_58,local_38);
  lex(&local_70,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_18 = &std::cout;
  local_10 = " ";
  std::
  copy<__gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>,std::ostream_iterator<Token,char,std::char_traits<char>>>
            ((Token *)local_80,
             (__normal_iterator<const_Token_*,_std::vector<Token,_std::allocator<Token>_>_>)
             local_70.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ostream_iterator<Token,_char,_std::char_traits<char>_> *)
             local_70.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish);
  parse((vector<Token,_std::allocator<Token>_> *)local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,local_38);
  poVar2 = std::operator<<(poVar2," = ");
  iVar1 = (*(code *)**(undefined8 **)local_80._0_8_)();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_70);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main()
{
	std::string input{"(13 - 4) - (12 + 1)"};
	auto res{lex(input)};
	std::copy(res.cbegin(), res.cend(), std::ostream_iterator<decltype(res)::value_type>(std::cout, " "));
	auto tree{parse(res)};
	std::cout << input << " = " << tree->eval() << std::endl;

	return 0;
}